

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O2

Var Js::TypedArrayBase::EntryFrom(RecyclableObject *function,CallInfo callInfo,...)

{
  ImplicitCallFlags IVar1;
  JavascriptLibrary *pJVar2;
  ThreadContext *pTVar3;
  code *pcVar4;
  ScriptContext *scriptContext;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  BOOL BVar8;
  uint uVar9;
  uint32 uVar10;
  Attributes AVar11;
  int iVar12;
  undefined4 *puVar13;
  Var pvVar14;
  ScriptContext *pSVar15;
  RecyclableObject *pRVar16;
  RecyclableObject *pRVar17;
  TempGuestArenaAllocatorObject *tempGuestAllocator;
  List<void_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer> *this;
  JavascriptArray *pJVar18;
  Type *ppvVar19;
  RecyclableObject *ptr;
  JavascriptArray *pJVar20;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint uVar21;
  int in_stack_00000010;
  undefined1 local_120 [8];
  AutoTagNativeLibraryEntry __tag;
  CallInfo callInfo_local;
  TypedArrayBase *local_e8;
  TypedArrayBase *local_e0;
  anon_class_24_3_1d317480_for_newObjectCreationFunction local_d8;
  undefined1 local_c0 [8];
  ArgumentReader args;
  JavascriptArray *local_a0;
  anon_class_40_5_9a3df42a local_98;
  RecyclableObject *local_70;
  RecyclableObject *items;
  RecyclableObject *local_60;
  undefined4 *local_58;
  TypedArrayBase *local_50;
  RecyclableObject *local_48;
  uint local_3c;
  ScriptContext *local_38;
  
  pSVar15 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
            scriptContext.ptr;
  __tag.entry.next = (Entry *)callInfo;
  ThreadContext::ProbeStack(pSVar15->threadContext,0xc00,pSVar15,(PVOID)0x0);
  if (callInfo._0_4_ != in_stack_00000010) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar13 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                ,0x55a,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar5) goto LAB_00bf7452;
    *puVar13 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)local_c0,(CallInfo *)&__tag.entry.next,(Var *)&stack0x00000018);
  pSVar15 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
            scriptContext.ptr;
  pJVar2 = (pSVar15->super_ScriptContextBase).javascriptLibrary;
  AutoTagNativeLibraryEntry::AutoTagNativeLibraryEntry
            ((AutoTagNativeLibraryEntry *)local_120,function,(CallInfo)__tag.entry.next,
             L"[TypedArray].from",&stack0x00000000);
  if (((ulong)__tag.entry.next & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar13 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                ,0x560,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar5) {
LAB_00bf7452:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar13 = 0;
  }
  if ((local_c0._0_4_ & 0xffffff) == 0) {
LAB_00bf7454:
    JavascriptError::ThrowTypeError(pSVar15,-0x7ff5ec40,L"[TypedArray].from");
  }
  pvVar14 = Arguments::operator[]((Arguments *)local_c0,0);
  bVar5 = JavascriptOperators::IsConstructor(pvVar14);
  if (!bVar5) goto LAB_00bf7454;
  local_38 = pSVar15;
  pvVar14 = Arguments::operator[]((Arguments *)local_c0,0);
  pSVar15 = (ScriptContext *)VarTo<Js::RecyclableObject>(pvVar14);
  bVar5 = JavascriptLibrary::IsTypedArrayConstructor(pSVar15,local_38);
  local_70 = (RecyclableObject *)0x0;
  if ((local_c0._0_4_ & 0xfffffe) == 0) {
LAB_00bf7468:
    JavascriptError::ThrowTypeError(local_38,-0x7ff5ec36,L"[TypedArray].from");
  }
  pvVar14 = Arguments::operator[]((Arguments *)local_c0,1);
  BVar8 = JavascriptConversion::ToObject(pvVar14,local_38,&local_70);
  if (BVar8 == 0) goto LAB_00bf7468;
  uVar9 = local_c0._0_4_ & 0xffffff;
  if (uVar9 < 3) {
    items = (RecyclableObject *)0x0;
    pRVar16 = (RecyclableObject *)0x0;
  }
  else {
    pvVar14 = Arguments::operator[]((Arguments *)local_c0,2);
    bVar6 = JavascriptConversion::IsCallable(pvVar14);
    if (!bVar6) {
      JavascriptError::ThrowTypeError(local_38,-0x7ff5ec34,L"[TypedArray].from");
    }
    pvVar14 = Arguments::operator[]((Arguments *)local_c0,2);
    pRVar16 = VarTo<Js::RecyclableObject>(pvVar14);
    if ((local_c0._0_4_ & 0xfffffc) == 0) {
      items = (pJVar2->super_JavascriptLibraryBase).undefinedValue.ptr;
    }
    else {
      items = (RecyclableObject *)Arguments::operator[]((Arguments *)local_c0,3);
    }
  }
  pRVar17 = JavascriptOperators::GetIterator(local_70,local_38,true);
  scriptContext = local_38;
  local_d8.constructor = (RecyclableObject *)pSVar15;
  local_60 = pRVar16;
  if (pRVar17 == (RecyclableObject *)0x0) {
    pvVar14 = JavascriptOperators::OP_GetLength(local_70,local_38);
    uVar10 = JavascriptConversion::ToUInt32(pvVar14,scriptContext);
    pRVar16 = local_70;
    args.super_Arguments.Values = (Type)CONCAT44(args.super_Arguments.Values._4_4_,uVar10);
    bVar6 = VarIsImpl<Js::TypedArrayBase>(local_70);
    if ((bVar6) &&
       (local_e0 = UnsafeVarTo<Js::TypedArrayBase,Js::RecyclableObject>(pRVar16),
       local_e0 != (TypedArrayBase *)0x0)) {
      local_58 = (undefined4 *)0x0;
      pJVar18 = (JavascriptArray *)0x0;
    }
    else {
      pJVar18 = JavascriptArray::TryVarToNonES5Array(local_70);
      local_58 = (undefined4 *)CONCAT71((int7)((ulong)pJVar18 >> 8),1);
      local_e0 = (TypedArrayBase *)0x0;
    }
    pTVar3 = local_38->threadContext;
    local_d8.len = (uint)args.super_Arguments.Values;
    local_d8.scriptContext = local_38;
    if (bVar5) {
      bVar5 = pTVar3->reentrancySafeOrHandled;
      pTVar3->reentrancySafeOrHandled = true;
      local_48 = (RecyclableObject *)
                 anon_func::anon_class_24_1_2f014396::
                 anon_class_24_3_1d317480_for_newObjectCreationFunction::operator()(&local_d8);
      pTVar3->reentrancySafeOrHandled = bVar5;
    }
    else {
      local_98.mapFnThisArg = local_38;
      local_98.mapFn =
           (RecyclableObject *)CONCAT44(local_d8._12_4_,(uint)args.super_Arguments.Values);
      bVar5 = pTVar3->reentrancySafeOrHandled;
      pTVar3->reentrancySafeOrHandled = true;
      local_98.scriptContext = pSVar15;
      AVar11 = FunctionInfo::GetAttributes((RecyclableObject *)pSVar15);
      bVar6 = ThreadContext::HasNoSideEffect(pTVar3,(RecyclableObject *)pSVar15,AVar11);
      if (bVar6) {
        pRVar16 = (RecyclableObject *)
                  anon_func::anon_class_24_1_2f014396::
                  anon_class_24_3_1d317480_for_newObjectCreationFunction::operator()
                            ((anon_class_24_3_1d317480_for_newObjectCreationFunction *)&local_98);
        bVar6 = ThreadContext::IsOnStack(pRVar16);
LAB_00bf6d64:
        local_48 = pRVar16;
        if (bVar6 != false) {
          pTVar3->implicitCallFlags = pTVar3->implicitCallFlags | ImplicitCall_Accessor;
        }
      }
      else if ((pTVar3->disableImplicitFlags & DisableImplicitCallFlag) == DisableImplicitNoFlag) {
        if ((AVar11 & HasNoSideEffect) != None) {
          pRVar16 = (RecyclableObject *)
                    anon_func::anon_class_24_1_2f014396::
                    anon_class_24_3_1d317480_for_newObjectCreationFunction::operator()
                              ((anon_class_24_3_1d317480_for_newObjectCreationFunction *)&local_98);
          bVar6 = ThreadContext::IsOnStack(pRVar16);
          goto LAB_00bf6d64;
        }
        IVar1 = pTVar3->implicitCallFlags;
        local_48 = (RecyclableObject *)
                   anon_func::anon_class_24_1_2f014396::
                   anon_class_24_3_1d317480_for_newObjectCreationFunction::operator()
                             ((anon_class_24_3_1d317480_for_newObjectCreationFunction *)&local_98);
        pTVar3->implicitCallFlags = IVar1 | ImplicitCall_Accessor;
      }
      else {
        pTVar3->implicitCallFlags = pTVar3->implicitCallFlags | ImplicitCall_Accessor;
        local_48 = (((((((Type *)&(((pSVar15->super_ScriptContextBase).javascriptLibrary)->
                                  super_JavascriptLibraryBase).globalObject)->ptr->
                       super_JavascriptLibraryBase).scriptContext.ptr)->super_ScriptContextBase).
                    javascriptLibrary)->super_JavascriptLibraryBase).undefinedValue.ptr;
      }
      pTVar3->reentrancySafeOrHandled = bVar5;
    }
    pSVar15 = local_38;
    pRVar16 = local_48;
    bVar5 = VarIs<Js::TypedArrayBase>(local_48);
    if ((bVar5) &&
       (local_e8 = UnsafeVarTo<Js::TypedArrayBase>(pRVar16), local_e8 != (TypedArrayBase *)0x0)) {
      bVar5 = false;
      pJVar20 = (JavascriptArray *)0x0;
    }
    else {
      pJVar20 = JavascriptArray::TryVarToNonES5Array(pRVar16);
      bVar5 = true;
      local_e8 = (TypedArrayBase *)0x0;
    }
    local_50 = (TypedArrayBase *)__tls_get_addr(&PTR_013e5f18);
    uVar21 = 0;
    while (pRVar16 = local_48, (uint)args.super_Arguments.Values != uVar21) {
      local_3c = uVar21;
      if ((char)local_58 == '\0') {
        iVar12 = (*(local_e0->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
                   super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
                   _vptr_IRecyclerVisitedObject[0x72])(local_e0,(ulong)uVar21);
        pRVar16 = (RecyclableObject *)CONCAT44(extraout_var_00,iVar12);
      }
      else if (pJVar18 == (JavascriptArray *)0x0) {
        pRVar16 = (RecyclableObject *)
                  JavascriptOperators::OP_GetElementI_UInt32(local_70,uVar21,pSVar15);
      }
      else {
        iVar12 = (*(pJVar18->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
                   super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                   [0x72])(pJVar18,(ulong)uVar21);
        pRVar16 = (RecyclableObject *)CONCAT44(extraout_var,iVar12);
      }
      if (2 < uVar9) {
        if (local_60 == (RecyclableObject *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *(undefined4 *)
           &(local_50->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
            super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject = 1;
          bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                      ,0x5ff,"(mapFn != nullptr)","mapFn != nullptr");
          if (!bVar6) goto LAB_00bf7452;
          *(undefined4 *)
           &(local_50->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
            super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject = 0;
        }
        if (items == (RecyclableObject *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *(undefined4 *)
           &(local_50->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
            super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject = 1;
          bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                      ,0x600,"(mapFnThisArg != nullptr)","mapFnThisArg != nullptr");
          if (!bVar6) goto LAB_00bf7452;
          *(undefined4 *)
           &(local_50->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
            super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject = 0;
        }
        local_98.kVar = JavascriptNumber::ToVar(local_3c,pSVar15);
        pRVar17 = local_60;
        pTVar3 = pSVar15->threadContext;
        local_98.mapFn = local_60;
        local_98.mapFnThisArg = items;
        bVar6 = pTVar3->reentrancySafeOrHandled;
        pTVar3->reentrancySafeOrHandled = true;
        local_98.scriptContext = pSVar15;
        local_98.kValue = pRVar16;
        AVar11 = FunctionInfo::GetAttributes(local_60);
        bVar7 = ThreadContext::HasNoSideEffect(pTVar3,pRVar17,AVar11);
        if (bVar7) {
          pRVar16 = (RecyclableObject *)EntryFrom::anon_class_40_5_9a3df42a::operator()(&local_98);
          bVar7 = ThreadContext::IsOnStack(pRVar16);
LAB_00bf72f9:
          if (bVar7 != false) {
            pTVar3->implicitCallFlags = pTVar3->implicitCallFlags | ImplicitCall_Accessor;
          }
        }
        else if ((pTVar3->disableImplicitFlags & DisableImplicitCallFlag) == DisableImplicitNoFlag)
        {
          if ((AVar11 & HasNoSideEffect) != None) {
            pRVar16 = (RecyclableObject *)EntryFrom::anon_class_40_5_9a3df42a::operator()(&local_98)
            ;
            bVar7 = ThreadContext::IsOnStack(pRVar16);
            goto LAB_00bf72f9;
          }
          IVar1 = pTVar3->implicitCallFlags;
          pRVar16 = (RecyclableObject *)EntryFrom::anon_class_40_5_9a3df42a::operator()(&local_98);
          pTVar3->implicitCallFlags = IVar1 | ImplicitCall_Accessor;
        }
        else {
          pTVar3->implicitCallFlags = pTVar3->implicitCallFlags | ImplicitCall_Accessor;
          pRVar16 = (((((((((local_60->type).ptr)->javascriptLibrary).ptr)->
                        super_JavascriptLibraryBase).scriptContext.ptr)->super_ScriptContextBase).
                     javascriptLibrary)->super_JavascriptLibraryBase).undefinedValue.ptr;
        }
        pTVar3->reentrancySafeOrHandled = bVar6;
        pSVar15 = local_38;
      }
      if (bVar5) {
        if (pJVar20 == (JavascriptArray *)0x0) {
          JavascriptOperators::OP_SetElementI_UInt32
                    (local_48,local_3c,pRVar16,pSVar15,PropertyOperation_ThrowIfNotExtensible);
        }
        else {
          (*(pJVar20->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
            super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
                    (pJVar20,(ulong)local_3c,pRVar16,4);
        }
      }
      else {
        (*(local_e8->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
          super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
          _vptr_IRecyclerVisitedObject[0x70])(local_e8,(ulong)local_3c,pRVar16);
      }
      uVar21 = local_3c + 1;
    }
    goto LAB_00bf73f9;
  }
  tempGuestAllocator = ScriptContext::GetTemporaryGuestAllocator(local_38,L"Runtime");
  this = IteratorToList(pRVar17,scriptContext,&tempGuestAllocator->allocator);
  local_d8.len = (this->super_ReadOnlyList<void_*,_Memory::ArenaAllocator,_DefaultComparer>).count;
  pTVar3 = scriptContext->threadContext;
  local_d8.scriptContext = scriptContext;
  local_3c = local_d8.len;
  if (bVar5) {
    bVar5 = pTVar3->reentrancySafeOrHandled;
    pTVar3->reentrancySafeOrHandled = true;
    local_48 = (RecyclableObject *)
               anon_func::anon_class_24_1_2f014396::
               anon_class_24_3_1d317480_for_newObjectCreationFunction::operator()(&local_d8);
    pTVar3->reentrancySafeOrHandled = bVar5;
  }
  else {
    local_98.mapFnThisArg = scriptContext;
    local_98.mapFn = (RecyclableObject *)CONCAT44(local_d8._12_4_,local_d8.len);
    bVar5 = pTVar3->reentrancySafeOrHandled;
    pTVar3->reentrancySafeOrHandled = true;
    local_98.scriptContext = pSVar15;
    AVar11 = FunctionInfo::GetAttributes((RecyclableObject *)pSVar15);
    bVar6 = ThreadContext::HasNoSideEffect(pTVar3,(RecyclableObject *)pSVar15,AVar11);
    if (bVar6) {
      pRVar16 = (RecyclableObject *)
                anon_func::anon_class_24_1_2f014396::
                anon_class_24_3_1d317480_for_newObjectCreationFunction::operator()
                          ((anon_class_24_3_1d317480_for_newObjectCreationFunction *)&local_98);
      bVar6 = ThreadContext::IsOnStack(pRVar16);
LAB_00bf6c59:
      local_48 = pRVar16;
      if (bVar6 != false) {
        pTVar3->implicitCallFlags = pTVar3->implicitCallFlags | ImplicitCall_Accessor;
      }
    }
    else if ((pTVar3->disableImplicitFlags & DisableImplicitCallFlag) == DisableImplicitNoFlag) {
      if ((AVar11 & HasNoSideEffect) != None) {
        pRVar16 = (RecyclableObject *)
                  anon_func::anon_class_24_1_2f014396::
                  anon_class_24_3_1d317480_for_newObjectCreationFunction::operator()
                            ((anon_class_24_3_1d317480_for_newObjectCreationFunction *)&local_98);
        bVar6 = ThreadContext::IsOnStack(pRVar16);
        goto LAB_00bf6c59;
      }
      IVar1 = pTVar3->implicitCallFlags;
      local_48 = (RecyclableObject *)
                 anon_func::anon_class_24_1_2f014396::
                 anon_class_24_3_1d317480_for_newObjectCreationFunction::operator()
                           ((anon_class_24_3_1d317480_for_newObjectCreationFunction *)&local_98);
      pTVar3->implicitCallFlags = IVar1 | ImplicitCall_Accessor;
    }
    else {
      pTVar3->implicitCallFlags = pTVar3->implicitCallFlags | ImplicitCall_Accessor;
      local_48 = (((((((Type *)&(((pSVar15->super_ScriptContextBase).javascriptLibrary)->
                                super_JavascriptLibraryBase).globalObject)->ptr->
                     super_JavascriptLibraryBase).scriptContext.ptr)->super_ScriptContextBase).
                  javascriptLibrary)->super_JavascriptLibraryBase).undefinedValue.ptr;
    }
    pTVar3->reentrancySafeOrHandled = bVar5;
  }
  pSVar15 = local_38;
  pRVar16 = local_48;
  bVar5 = VarIs<Js::TypedArrayBase>(local_48);
  pRVar17 = local_60;
  if ((bVar5) &&
     (local_50 = UnsafeVarTo<Js::TypedArrayBase>(pRVar16), local_50 != (TypedArrayBase *)0x0)) {
    args.super_Arguments.Values = (Type)0x0;
    local_a0 = (JavascriptArray *)0x0;
  }
  else {
    local_a0 = JavascriptArray::TryVarToNonES5Array(pRVar16);
    args.super_Arguments.Values = (Type)CONCAT71((int7)((ulong)local_a0 >> 8),1);
    local_50 = (TypedArrayBase *)0x0;
  }
  local_58 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  for (uVar21 = 0; local_3c != uVar21; uVar21 = uVar21 + 1) {
    ppvVar19 = JsUtil::
               List<void_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
               Item(this,uVar21);
    ptr = (RecyclableObject *)*ppvVar19;
    if (2 < uVar9) {
      if (pRVar17 == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *local_58 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                    ,0x5b4,"(mapFn != nullptr)","mapFn != nullptr");
        if (!bVar5) goto LAB_00bf7452;
        *local_58 = 0;
      }
      if (items == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *local_58 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                    ,0x5b5,"(mapFnThisArg != nullptr)","mapFnThisArg != nullptr");
        if (!bVar5) goto LAB_00bf7452;
        *local_58 = 0;
      }
      pSVar15 = local_38;
      local_98.kVar = JavascriptNumber::ToVar(uVar21,local_38);
      pTVar3 = pSVar15->threadContext;
      local_98.scriptContext = pSVar15;
      local_98.mapFnThisArg = items;
      bVar5 = pTVar3->reentrancySafeOrHandled;
      pTVar3->reentrancySafeOrHandled = true;
      local_98.mapFn = pRVar17;
      local_98.kValue = ptr;
      AVar11 = FunctionInfo::GetAttributes(pRVar17);
      bVar6 = ThreadContext::HasNoSideEffect(pTVar3,pRVar17,AVar11);
      if (bVar6) {
        ptr = (RecyclableObject *)EntryFrom::anon_class_40_5_9a3df42a::operator()(&local_98);
        bVar6 = ThreadContext::IsOnStack(ptr);
LAB_00bf6fd5:
        if (bVar6 != false) {
          pTVar3->implicitCallFlags = pTVar3->implicitCallFlags | ImplicitCall_Accessor;
        }
      }
      else if ((pTVar3->disableImplicitFlags & DisableImplicitCallFlag) == DisableImplicitNoFlag) {
        if ((AVar11 & HasNoSideEffect) != None) {
          ptr = (RecyclableObject *)EntryFrom::anon_class_40_5_9a3df42a::operator()(&local_98);
          bVar6 = ThreadContext::IsOnStack(ptr);
          goto LAB_00bf6fd5;
        }
        IVar1 = pTVar3->implicitCallFlags;
        ptr = (RecyclableObject *)EntryFrom::anon_class_40_5_9a3df42a::operator()(&local_98);
        pTVar3->implicitCallFlags = IVar1 | ImplicitCall_Accessor;
      }
      else {
        pTVar3->implicitCallFlags = pTVar3->implicitCallFlags | ImplicitCall_Accessor;
        ptr = (((((((((local_60->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                  scriptContext.ptr)->super_ScriptContextBase).javascriptLibrary)->
              super_JavascriptLibraryBase).undefinedValue.ptr;
      }
      pTVar3->reentrancySafeOrHandled = bVar5;
      pRVar17 = local_60;
      pRVar16 = local_48;
    }
    if ((char)args.super_Arguments.Values == '\0') {
      (*(local_50->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
        super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
        _vptr_IRecyclerVisitedObject[0x70])(local_50,(ulong)uVar21,ptr);
    }
    else if (local_a0 == (JavascriptArray *)0x0) {
      JavascriptOperators::OP_SetElementI_UInt32
                (pRVar16,uVar21,ptr,local_38,PropertyOperation_ThrowIfNotExtensible);
    }
    else {
      (*(local_a0->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
        super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
                (local_a0,(ulong)uVar21,ptr,4);
    }
    pSVar15 = local_38;
  }
  ScriptContext::ReleaseTemporaryGuestAllocator(pSVar15,tempGuestAllocator);
LAB_00bf73f9:
  AutoTagNativeLibraryEntry::~AutoTagNativeLibraryEntry((AutoTagNativeLibraryEntry *)local_120);
  return pRVar16;
}

Assistant:

Var TypedArrayBase::EntryFrom(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();
        JavascriptLibrary* library = scriptContext->GetLibrary();

        AUTO_TAG_NATIVE_LIBRARY_ENTRY(function, callInfo, _u("[TypedArray].from"));

        Assert(!(callInfo.Flags & CallFlags_New));
        CHAKRATEL_LANGSTATS_INC_BUILTINCOUNT(TypedArray_Prototype_from);

        if (args.Info.Count < 1 || !JavascriptOperators::IsConstructor(args[0]))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NeedFunction, _u("[TypedArray].from"));
        }

        RecyclableObject* constructor = VarTo<RecyclableObject>(args[0]);
        bool isDefaultConstructor = JavascriptLibrary::IsTypedArrayConstructor(constructor, scriptContext);
        RecyclableObject* items = nullptr;

        if (args.Info.Count < 2 || !JavascriptConversion::ToObject(args[1], scriptContext, &items))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedObject, _u("[TypedArray].from"));
        }

        bool mapping = false;
        RecyclableObject* mapFn = nullptr;
        Var mapFnThisArg = nullptr;

        if (args.Info.Count >= 3)
        {
            if (!JavascriptConversion::IsCallable(args[2]))
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedFunction, _u("[TypedArray].from"));
            }

            mapFn = VarTo<RecyclableObject>(args[2]);

            if (args.Info.Count >= 4)
            {
                mapFnThisArg = args[3];
            }
            else
            {
                mapFnThisArg = library->GetUndefined();
            }

            mapping = true;
        }

        Var newObj;
        RecyclableObject* iterator = JavascriptOperators::GetIterator(items, scriptContext, true /* optional */);

        if (iterator != nullptr)
        {
            DECLARE_TEMP_GUEST_ALLOCATOR(tempAlloc);

            ACQUIRE_TEMP_GUEST_ALLOCATOR(tempAlloc, scriptContext, _u("Runtime"));
            {
                // Create a temporary list to hold the items returned from the iterator.
                // We will then iterate over this list and append those items into the object we will return.
                // We have to collect the items into this temporary list because we need to call the
                // new object constructor with a length of items and we don't know what length will be
                // until we iterate across all the items.
                // Consider: Could be possible to fast-path this in order to avoid creating the temporary list
                //       for types we know such as TypedArray. We know the length of a TypedArray but we still
                //       have to be careful in case there is a proxy which could return anything from [[Get]]
                //       or the built-in @@iterator has been replaced.
                JsUtil::List<Var, ArenaAllocator>* tempList = IteratorToList(iterator, scriptContext, tempAlloc);

                uint32 len = tempList->Count();
                newObj = JavascriptOperators::NewObjectCreationHelper_ReentrancySafe(constructor, isDefaultConstructor, scriptContext->GetThreadContext(), [=]()->Js::Var
                {
                    Js::Var constructorArgs[] = { constructor, JavascriptNumber::ToVar(len, scriptContext) };
                    Js::CallInfo constructorCallInfo(Js::CallFlags_New, _countof(constructorArgs));
                    return TypedArrayCreate(constructor, &Js::Arguments(constructorCallInfo, constructorArgs), len, scriptContext);
                });

                TypedArrayBase* newTypedArrayBase = JavascriptOperators::TryFromVar<Js::TypedArrayBase>(newObj);
                JavascriptArray* newArr = nullptr;

                if (!newTypedArrayBase)
                {
                    newArr = JavascriptArray::TryVarToNonES5Array(newObj);
                }

                for (uint32 k = 0; k < len; k++)
                {
                    Var kValue = tempList->Item(k);

                    if (mapping)
                    {
                        Assert(mapFn != nullptr);
                        Assert(mapFnThisArg != nullptr);

                        Var kVar = JavascriptNumber::ToVar(k, scriptContext);
                        kValue = scriptContext->GetThreadContext()->ExecuteImplicitCall(mapFn, Js::ImplicitCall_Accessor, [=]()->Js::Var
                        {
                            return CALL_FUNCTION(scriptContext->GetThreadContext(), mapFn, CallInfo(CallFlags_Value, 3), mapFnThisArg, kValue, kVar);
                        });
                    }

                    // We're likely to have constructed a new TypedArray, but the constructor could return any object
                    if (newTypedArrayBase)
                    {
                        newTypedArrayBase->DirectSetItem(k, kValue);
                    }
                    else if (newArr)
                    {
                        newArr->SetItem(k, kValue, Js::PropertyOperation_ThrowIfNotExtensible);
                    }
                    else
                    {
                        JavascriptOperators::OP_SetElementI_UInt32(newObj, k, kValue, scriptContext, Js::PropertyOperation_ThrowIfNotExtensible);
                    }
                }
            }
            RELEASE_TEMP_GUEST_ALLOCATOR(tempAlloc, scriptContext);
        }
        else
        {
            Var lenValue = JavascriptOperators::OP_GetLength(items, scriptContext);
            uint32 len = JavascriptConversion::ToUInt32(lenValue, scriptContext);

            TypedArrayBase* itemsTypedArrayBase = JavascriptOperators::TryFromVar<Js::TypedArrayBase>(items);
            JavascriptArray* itemsArray = nullptr;

            if (!itemsTypedArrayBase)
            {
                itemsArray = JavascriptArray::TryVarToNonES5Array(items);
            }

            newObj = JavascriptOperators::NewObjectCreationHelper_ReentrancySafe(constructor, isDefaultConstructor, scriptContext->GetThreadContext(), [=]()->Js::Var
            {
                Js::Var constructorArgs[] = { constructor, JavascriptNumber::ToVar(len, scriptContext) };
                Js::CallInfo constructorCallInfo(Js::CallFlags_New, _countof(constructorArgs));
                return TypedArrayBase::TypedArrayCreate(constructor, &Js::Arguments(constructorCallInfo, constructorArgs), len, scriptContext);
            });

            TypedArrayBase* newTypedArrayBase = JavascriptOperators::TryFromVar<Js::TypedArrayBase>(newObj);
            JavascriptArray* newArr = nullptr;

            if (!newTypedArrayBase)
            {
                newArr = JavascriptArray::TryVarToNonES5Array(newObj);
            }

            for (uint32 k = 0; k < len; k++)
            {
                Var kValue;

                // The items source could be anything, but we already know if it's a TypedArray or Array
                if (itemsTypedArrayBase)
                {
                    kValue = itemsTypedArrayBase->DirectGetItem(k);
                }
                else if (itemsArray)
                {
                    kValue = itemsArray->DirectGetItem(k);
                }
                else
                {
                    kValue = JavascriptOperators::OP_GetElementI_UInt32(items, k, scriptContext);
                }

                if (mapping)
                {
                    Assert(mapFn != nullptr);
                    Assert(mapFnThisArg != nullptr);

                    Var kVar = JavascriptNumber::ToVar(k, scriptContext);
                    kValue = scriptContext->GetThreadContext()->ExecuteImplicitCall(mapFn, Js::ImplicitCall_Accessor, [=]()->Js::Var
                    {
                        return CALL_FUNCTION(scriptContext->GetThreadContext(), mapFn, CallInfo(CallFlags_Value, 3), mapFnThisArg, kValue, kVar);
                    });
                }

                // If constructor built a TypedArray (likely) or Array (maybe likely) we can do a more direct set operation
                if (newTypedArrayBase)
                {
                    newTypedArrayBase->DirectSetItem(k, kValue);
                }
                else if (newArr)
                {
                    newArr->SetItem(k, kValue, Js::PropertyOperation_ThrowIfNotExtensible);
                }
                else
                {
                    JavascriptOperators::OP_SetElementI_UInt32(newObj, k, kValue, scriptContext, Js::PropertyOperation_ThrowIfNotExtensible);
                }
            }
        }

        return newObj;
    }